

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *psVar1;
  cmSourceFile *this_00;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  psVar1 = GetCurrentBinaryDirectory_abi_cxx11_(this);
  local_78.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_78.View_._M_len = psVar1->_M_string_length;
  local_48.View_._M_len = 0xc;
  local_48.View_._M_str = "/CMakeFiles/";
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_78,&local_48,targetName);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error((string *)&local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"SYMBOLIC",(allocator<char> *)&local_48);
    cmSourceFile::SetProperty(this_00,(string *)&local_78,"1");
  }
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}